

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_staj_filter_view<char>::basic_staj_filter_view
          (basic_staj_filter_view<char> *this,basic_staj_cursor<char> *cursor,
          function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>
          *pred)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **in_RSI;
  basic_staj_cursor<char> *in_RDI;
  function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>
  *in_stack_ffffffffffffffa8;
  basic_staj_event<char> *__args;
  function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>
  *in_stack_ffffffffffffffb0;
  byte local_42;
  function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)> *this_00;
  
  basic_staj_cursor<char>::basic_staj_cursor(in_RDI);
  in_RDI->_vptr_basic_staj_cursor = (_func_int **)&PTR__basic_staj_filter_view_013368d0;
  in_RDI[1]._vptr_basic_staj_cursor = in_RSI;
  std::function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>::
  function(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  while( true ) {
    uVar2 = (*in_RDI->_vptr_basic_staj_cursor[3])();
    local_42 = 0;
    if ((uVar2 & 1) == 0) {
      __args = (basic_staj_event<char> *)(in_RDI + 2);
      iVar3 = (*in_RDI->_vptr_basic_staj_cursor[4])();
      this_00 = (function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>
                 *)CONCAT44(extraout_var,iVar3);
      iVar3 = (*in_RDI->_vptr_basic_staj_cursor[9])();
      bVar1 = std::
              function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>
              ::operator()(this_00,__args,(ser_context *)CONCAT44(extraout_var_00,iVar3));
      local_42 = bVar1 ^ 0xff;
    }
    if ((local_42 & 1) == 0) break;
    (**(code **)(*in_RDI[1]._vptr_basic_staj_cursor + 0x38))();
  }
  return;
}

Assistant:

basic_staj_filter_view(basic_staj_cursor<CharT>& cursor, 
                     std::function<bool(const basic_staj_event<CharT>&, const ser_context&)> pred)
        : cursor_(std::addressof(cursor)), pred_(pred)
    {
        while (!done() && !pred_(current(),context()))
        {
            cursor_->next();
        }
    }